

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprintf.c
# Opt level: O2

int alloc_addbyter(uchar outc,void *f)

{
  CURLcode CVar1;
  uchar outc_local;
  
  outc_local = outc;
  CVar1 = Curl_dyn_addn(*f,&outc_local,1);
  if (CVar1 != CURLE_OK) {
    *(char *)((long)f + 8) = (CVar1 == CURLE_TOO_LARGE) + '\x01';
  }
  return (uint)(CVar1 != CURLE_OK);
}

Assistant:

static int alloc_addbyter(unsigned char outc, void *f)
{
  struct asprintf *infop = f;
  CURLcode result = Curl_dyn_addn(infop->b, &outc, 1);
  if(result) {
    infop->merr = result == CURLE_TOO_LARGE ? MERR_TOO_LARGE : MERR_MEM;
    return 1 ; /* fail */
  }
  return 0;
}